

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O3

upb_MessageValue
upb_Message_GetField(upb_Message *msg,upb_MiniTableField *field,upb_MessageValue default_val)

{
  byte bVar1;
  upb_Extension *puVar2;
  ulong uVar3;
  upb_MessageValue uVar4;
  
  uVar3 = default_val.uint64_val;
  bVar1 = field->mode_dont_copy_me__upb_internal_use_only;
  if ((bVar1 & 8) == 0) {
    if (-1 < field->presence) {
      uVar4 = (upb_MessageValue)
              (*(code *)(&DAT_0047fff8 + *(int *)(&DAT_0047fff8 + (ulong)(bVar1 >> 6) * 4)))
                        (msg,&DAT_0047fff8 + *(int *)(&DAT_0047fff8 + (ulong)(bVar1 >> 6) * 4));
      return uVar4;
    }
    bVar1 = bVar1 >> 6;
    if (*(uint32_t *)((long)&msg->field_0 + (ulong)((ushort)field->presence ^ 0xffff)) ==
        field->number_dont_copy_me__upb_internal_use_only) {
      uVar4 = (upb_MessageValue)
              (*(code *)(&DAT_00480008 + *(int *)(&DAT_00480008 + (ulong)bVar1 * 4)))
                        ((long)&msg->field_0 +
                         (ulong)field->offset_dont_copy_me__upb_internal_use_only);
      return uVar4;
    }
  }
  else {
    puVar2 = _upb_Message_Getext_dont_copy_me__upb_internal_use_only
                       (msg,(upb_MiniTableExtension *)field);
    bVar1 = field->mode_dont_copy_me__upb_internal_use_only;
    if ((bVar1 & 8) == 0) {
      __assert_fail("upb_MiniTableField_IsExtension(f)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                    ,0x11d,
                    "void _upb_Message_GetExtensionField(const struct upb_Message *, const upb_MiniTableExtension *, const void *, void *)"
                   );
    }
    if (puVar2 != (upb_Extension *)0x0) {
      uVar4 = (upb_MessageValue)
              (*(code *)(&DAT_0047ffe8 + *(int *)(&DAT_0047ffe8 + (ulong)(bVar1 >> 6) * 4)))();
      return uVar4;
    }
    bVar1 = bVar1 >> 6;
  }
  if (1 < bVar1 - 2) {
    if (bVar1 == 1) {
      uVar3 = uVar3 & 0xffffffff;
    }
    else {
      uVar3 = uVar3 & 0xff;
    }
  }
  uVar4.str_val.size = default_val.str_val.size;
  uVar4.uint64_val = uVar3;
  return uVar4;
}

Assistant:

UPB_API_INLINE upb_MessageValue upb_Message_GetField(
    const struct upb_Message* msg, const upb_MiniTableField* field,
    upb_MessageValue default_val) {
  upb_MessageValue ret;
  if (upb_MiniTableField_IsExtension(field)) {
    _upb_Message_GetExtensionField(msg, (upb_MiniTableExtension*)field,
                                   &default_val, &ret);
  } else {
    _upb_Message_GetNonExtensionField(msg, field, &default_val, &ret);
  }
  return ret;
}